

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwards.h
# Opt level: O2

void __thiscall
miniros::SubscriberCallbacks::SubscriberCallbacks
          (SubscriberCallbacks *this,SubscriberStatusCallback *connect,
          SubscriberStatusCallback *disconnect,VoidConstPtr *tracked_object,
          CallbackQueueInterface *callback_queue)

{
  std::function<void_(const_miniros::SingleSubscriberPublisher_&)>::function
            (&this->connect_,connect);
  std::function<void_(const_miniros::SingleSubscriberPublisher_&)>::function
            (&this->disconnect_,disconnect);
  (this->tracked_object_).super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->tracked_object_).super___weak_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->callback_queue_ = callback_queue;
  this->has_tracked_object_ = false;
  if ((tracked_object->super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    this->has_tracked_object_ = true;
    std::__weak_ptr<void_const,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_ptr<void_const,(__gnu_cxx::_Lock_policy)2> *)&this->tracked_object_,
               &tracked_object->super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>);
    return;
  }
  return;
}

Assistant:

SubscriberCallbacks(const SubscriberStatusCallback& connect = SubscriberStatusCallback(),
                      const SubscriberStatusCallback& disconnect = SubscriberStatusCallback(),
                      const VoidConstPtr& tracked_object = VoidConstPtr(),
                      CallbackQueueInterface* callback_queue = 0)
  : connect_(connect)
  , disconnect_(disconnect)
  , callback_queue_(callback_queue)
  {
    has_tracked_object_ = false;
    if (tracked_object)
    {
      has_tracked_object_ = true;
      tracked_object_ = tracked_object;
    }
  }